

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools.h
# Opt level: O0

void __thiscall
hashset<hashtableentry<char_*,_int>_>::hashset(hashset<hashtableentry<char_*,_int>_> *this,int size)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  chain **ppcVar3;
  int local_18;
  int i;
  int size_local;
  hashset<hashtableentry<char_*,_int>_> *this_local;
  
  this->size = size;
  this->numelems = 0;
  this->chunks = (chainchunk *)0x0;
  this->unused = (chain *)0x0;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)size;
  uVar2 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  ppcVar3 = (chain **)operator_new__(uVar2);
  this->chains = ppcVar3;
  for (local_18 = 0; local_18 < size; local_18 = local_18 + 1) {
    this->chains[local_18] = (chain *)0x0;
  }
  return;
}

Assistant:

hashset(int size = 1<<10)
    : size(size)
    {
        numelems = 0;
        chunks = NULL;
        unused = NULL;
        chains = new chain *[size];
        loopi(size) chains[i] = NULL;
    }